

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_5450::TlbExportVisitor::visit_
          (TlbExportVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  string local_80;
  string local_60;
  string local_40;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<field name=\"",0xd);
  Typelib::Field::getName_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," type=\"",7);
  Typelib::Field::getType();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_60,&local_40);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," offset=\"",9);
  Typelib::Field::getOffset();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  auVar2 = Typelib::Field::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            (&local_80,auVar2._0_8_,auVar2._8_8_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</field>\n",9);
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << "<field name=\"" << field.getName() << "\""
            << " type=\""   << xmlEscape(field.getType().getName())  << "\""
            << " offset=\"" << field.getOffset() << "\">\n";
        m_stream << m_indent << emitMetaData(field.getMetaData()) << "\n";
        m_stream << m_indent << "</field>\n";
        return true;
    }